

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O0

void __thiscall TApp_IniNoSubFailure_Test::TestBody(TApp_IniNoSubFailure_Test *this)

{
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  AssertHelper local_300;
  Message local_2f8 [2];
  INIError *anon_var_0;
  char *pcStack_2e0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ofstream out;
  allocator local_d1;
  string local_d0;
  string local_b0;
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  TempFile tmpini;
  TApp_IniNoSubFailure_Test *this_local;
  
  tmpini._name.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"TestIniTmp.ini",&local_51);
  TempFile::TempFile((TempFile *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"--config",&local_89);
  psVar2 = TempFile::operator_cast_to_string_((TempFile *)local_30);
  std::__cxx11::string::string((string *)&local_b0,(string *)psVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"Read an ini file",&local_d1);
  CLI::App::set_config(&(this->super_TApp).app,&local_88,&local_b0,&local_d0,false);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  psVar2 = TempFile::operator_cast_to_string_((TempFile *)local_30);
  std::ofstream::ofstream(&gtest_msg,psVar2,0x10);
  poVar3 = std::operator<<((ostream *)&gtest_msg,"[other]");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&gtest_msg,"val=1");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ofstream::~ofstream(&gtest_msg);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffd20,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffd20);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_0011e5ea;
    pcStack_2e0 = 
    "Expected: run() throws an exception of type CLI::INIError.\n  Actual: it throws nothing.";
  }
  testing::Message::Message(local_2f8);
  testing::internal::AssertHelper::AssertHelper
            (&local_300,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
             ,0x1bd,pcStack_2e0);
  testing::internal::AssertHelper::operator=(&local_300,local_2f8);
  testing::internal::AssertHelper::~AssertHelper(&local_300);
  testing::Message::~Message(local_2f8);
LAB_0011e5ea:
  TempFile::~TempFile((TempFile *)local_30);
  return;
}

Assistant:

TEST_F(TApp, IniNoSubFailure) {

    TempFile tmpini{"TestIniTmp.ini"};

    app.set_config("--config", tmpini);

    {
        std::ofstream out{tmpini};
        out << "[other]" << std::endl;
        out << "val=1" << std::endl;
    }

    EXPECT_THROW(run(), CLI::INIError);
}